

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBackgroundBorder.cpp
# Opt level: O3

void __thiscall
Rml::GeometryBackgroundBorder::DrawArcPoint
          (GeometryBackgroundBorder *this,Vector2f pos_center,Vector2f pos_inner,float R,float a0,
          float a1,ColourbPremultiplied color0,ColourbPremultiplied color1,int num_points)

{
  uint uVar1;
  vector<Rml::Vertex,_std::allocator<Rml::Vertex>_> *this_00;
  Vector2f VVar2;
  vector<int,_std::allocator<int>_> *this_01;
  pointer piVar3;
  code *pcVar4;
  bool bVar5;
  int iVar6;
  pointer pVVar7;
  pointer piVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  
  if (R <= 0.0 || num_points < 2) {
    bVar5 = Assert("RMLUI_ASSERT(R > 0 && num_points >= 2)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,299);
    if (!bVar5) goto LAB_00247bfa;
  }
  this_00 = this->vertices;
  iVar6 = (int)((ulong)((long)(this_00->
                              super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl
                              .super__Vector_impl_data._M_finish -
                       (long)(this_00->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>
                             )._M_impl.super__Vector_impl_data._M_start) >> 2);
  iVar11 = iVar6 * -0x33333333;
  ::std::vector<Rml::Vertex,_std::allocator<Rml::Vertex>_>::reserve
            (this_00,(long)(num_points + iVar11 + 2));
  DrawPoint(this,pos_inner,color0);
  VVar2.y = R;
  VVar2.x = R;
  DrawArc(this,pos_center,VVar2,a0,a1,color0,color1,num_points);
  DrawPoint(this,pos_inner,color1);
  pVVar7 = (this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar13 = (int)((ulong)((long)(this->vertices->
                               super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                               _M_impl.super__Vector_impl_data._M_finish - (long)pVVar7) >> 2) *
           -0x33333333;
  if (iVar13 + iVar6 * 0x33333333 != num_points + 2) {
    bVar5 = Assert("RMLUI_ASSERT((int)vertices.size() - offset_vertices == num_points + 2)",
                   "/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBackgroundBorder.cpp"
                   ,0x135);
    if (!bVar5) {
LAB_00247bfa:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    pVVar7 = (this->vertices->super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>)._M_impl
             .super__Vector_impl_data._M_start;
    iVar13 = (int)((ulong)((long)(this->vertices->
                                 super__Vector_base<Rml::Vertex,_std::allocator<Rml::Vertex>_>).
                                 _M_impl.super__Vector_impl_data._M_finish - (long)pVVar7) >> 2) *
             -0x33333333;
  }
  iVar6 = iVar13 + -1;
  iVar13 = iVar13 + -2;
  VVar2 = pVVar7[iVar13].position;
  pVVar7[iVar13].position = pVVar7[iVar6].position;
  pVVar7[iVar6].position = VVar2;
  uVar1 = num_points - 1;
  this_01 = this->indices;
  iVar12 = (int)((ulong)((long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_start) >> 2);
  ::std::vector<int,_std::allocator<int>_>::resize(this_01,(long)(int)(uVar1 * 3 + iVar12));
  piVar3 = (this->indices->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (1 < num_points) {
    piVar8 = piVar3 + (long)iVar12 + 2;
    uVar9 = 0;
    do {
      iVar10 = iVar11;
      if (uVar1 >> 1 < uVar9) {
        iVar10 = iVar13;
      }
      piVar8[-2] = iVar10;
      piVar8[-1] = iVar11 + 2 + (int)uVar9;
      *piVar8 = iVar11 + 1 + (int)uVar9;
      uVar9 = uVar9 + 1;
      piVar8 = piVar8 + 3;
    } while (uVar1 != uVar9);
  }
  piVar3[(long)(num_points * 3 + iVar12 + -6) + 1] = iVar6;
  return;
}

Assistant:

void GeometryBackgroundBorder::DrawArcPoint(Vector2f pos_center, Vector2f pos_inner, float R, float a0, float a1, ColourbPremultiplied color0,
	ColourbPremultiplied color1, int num_points)
{
	RMLUI_ASSERT(R > 0 && num_points >= 2);

	const int offset_vertices = (int)vertices.size();
	vertices.reserve(offset_vertices + num_points + 2);

	// Generate the vertices. We could also split the arc mid-way to create a sharp color transition.
	DrawPoint(pos_inner, color0);
	DrawArc(pos_center, Vector2f(R), a0, a1, color0, color1, num_points);
	DrawPoint(pos_inner, color1);

	RMLUI_ASSERT((int)vertices.size() - offset_vertices == num_points + 2);

	// Swap the last two vertices such that the outer edge vertex is last, see the comment for the border drawing functions. Their colors should
	// already be the same.
	const int last_vertex = (int)vertices.size() - 1;
	std::swap(vertices[last_vertex - 1].position, vertices[last_vertex].position);

	// Generate the indices
	const int num_triangles = (num_points - 1);

	const int i_vertex_inner0 = offset_vertices;
	const int i_vertex_inner1 = last_vertex - 1;

	const int offset_indices = (int)indices.size();
	indices.resize(offset_indices + 3 * num_triangles);

	for (int i = 0; i < num_triangles; i++)
	{
		indices[offset_indices + 3 * i + 0] = (i > num_triangles / 2 ? i_vertex_inner1 : i_vertex_inner0);
		indices[offset_indices + 3 * i + 1] = offset_vertices + i + 2;
		indices[offset_indices + 3 * i + 2] = offset_vertices + i + 1;
	}

	// Since we swapped the last two vertices we also need to change the last triangle.
	indices[offset_indices + 3 * (num_triangles - 1) + 1] = last_vertex;
}